

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O2

void __thiscall
QMakeParser::finalizeCall(QMakeParser *this,ushort **tokPtr,ushort *uc,ushort *ptr,int argc)

{
  ushort uVar1;
  ushort *puVar2;
  bool bVar3;
  int iVar4;
  ushort *puVar5;
  storage_type *psVar6;
  iterator iVar7;
  uint len;
  ushort *puVar8;
  QString *a;
  QMakeParser *pQVar9;
  QArrayDataPointer<char16_t> *this_00;
  ulong uVar10;
  ushort uVar11;
  QString *s1;
  char *pcVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  size_t sStack_90;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*uc == 9) && (uVar10 = (ulong)uc[3], uc[uVar10 + 4] == 0x11)) {
    puVar5 = uc + uVar10 + 5;
    s1 = &this->m_tmp;
    QString::setRawData((QChar *)s1,(longlong)(uc + 4));
    bVar3 = comparesEqual(s1,(QString *)((anonymous_namespace)::statics + 0x18));
    if (bVar3) {
      bVar3 = acceptColon(this,"in front of for()");
      if (bVar3) {
        pQVar9 = this;
        flushCond(this,tokPtr);
        iVar4 = this->m_markLine;
        if (iVar4 != 0) {
          puVar8 = *tokPtr;
          *puVar8 = 1;
          *tokPtr = puVar8 + 2;
          puVar8[1] = (ushort)iVar4;
          this->m_markLine = 0;
        }
        if (*puVar5 == 0x208) {
          uVar1 = uc[uVar10 + 6];
          puVar8 = uc + uVar10 + 7;
          if (uc + uVar10 + (ulong)uVar1 + 7 == ptr + -1) {
            puVar5 = *tokPtr;
            *tokPtr = puVar5 + 1;
            *puVar5 = 0x19;
            putHashStr(pQVar9,tokPtr,(ushort *)0x0,0);
            puVar5 = *tokPtr;
            *(uint *)puVar5 = uVar1 + 5;
            *tokPtr = puVar5 + 3;
            puVar5[2] = 9;
            putHashStr(pQVar9,tokPtr,puVar8,(uint)uVar1);
            puVar5 = *tokPtr;
          }
          else {
            if ((argc != 2) || (uc[uVar10 + (ulong)uVar1 + 7] != 0xe)) goto LAB_00205a79;
            puVar5 = uc + uVar10 + (ulong)uVar1 + 8;
            puVar2 = *tokPtr;
            *tokPtr = puVar2 + 1;
            *puVar2 = 0x19;
            len = (uint)uVar1;
LAB_00205996:
            putHashStr(pQVar9,tokPtr,puVar8,len);
            uVar10 = (long)(ptr + -1) - (long)puVar5;
            iVar4 = (int)(uVar10 >> 1) + 1;
            puVar8 = *tokPtr;
            *puVar8 = (ushort)iVar4;
            *tokPtr = puVar8 + 2;
            puVar8[1] = (ushort)((uint)iVar4 >> 0x10);
            memcpy(puVar8 + 2,puVar5,uVar10 & 0xffffffff);
            puVar5 = (ushort *)((uVar10 & 0x1fffffffe) + (long)*tokPtr);
          }
          *tokPtr = puVar5 + 1;
          *puVar5 = 7;
          enterScope(this,tokPtr,true,StCtrl);
          iVar7 = QList<QMakeParser::BlockScope>::end
                            (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
          iVar7.i[-1].nest = iVar7.i[-1].nest | 1;
          goto LAB_00205e15;
        }
        if (argc == 1) {
          puVar8 = *tokPtr;
          *tokPtr = puVar8 + 1;
          *puVar8 = 0x19;
          puVar8 = (ushort *)0x0;
          len = 0;
          goto LAB_00205996;
        }
LAB_00205a79:
        psVar6 = (storage_type *)
                 QByteArrayView::lengthHelperCharArray
                           ("Syntax is for(var, list), for(var, forever) or for(ever).",0x3a);
        QVar15.m_data = psVar6;
        QVar15.m_size = (qsizetype)&local_58;
        QString::fromLatin1(QVar15);
LAB_00205aa1:
        this_00 = &local_58;
        parseError(this,(QString *)this_00);
      }
      else {
        this_00 = &local_58;
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
        bogusTest(this,tokPtr,(QString *)this_00);
      }
    }
    else {
      a = (QString *)((anonymous_namespace)::statics + 0x48);
      bVar3 = comparesEqual(s1,(QString *)((anonymous_namespace)::statics + 0x48));
      uVar11 = 0x1b;
      if (bVar3) {
LAB_00205867:
        if (this->m_invert == 0) {
          flushScopes(this,tokPtr);
          iVar4 = this->m_markLine;
          if (iVar4 != 0) {
            puVar8 = *tokPtr;
            *puVar8 = 1;
            *tokPtr = puVar8 + 2;
            puVar8[1] = (ushort)iVar4;
            this->m_markLine = 0;
          }
          if ((*puVar5 != 0x208) || (uVar1 = uc[uVar10 + 6], uc[uVar10 + (ulong)uVar1 + 7] != 0xf))
          {
            psVar6 = (storage_type *)
                     QByteArrayView::lengthHelperCharArray
                               ("%1(function) requires one literal argument.",0x2c);
            QVar14.m_data = psVar6;
            QVar14.m_size = (qsizetype)&local_70;
            QString::fromLatin1(QVar14);
            QString::arg<QString,_true>((QString *)&local_58,(QString *)&local_70,a,0,(QChar)0x20);
            parseError(this,(QString *)&local_58);
            goto LAB_00205d55;
          }
          pQVar9 = this;
          putOperator(this,tokPtr);
          puVar5 = *tokPtr;
          *tokPtr = puVar5 + 1;
          *puVar5 = uVar11;
          putHashStr(pQVar9,tokPtr,uc + uVar10 + 7,(uint)uVar1);
          enterScope(this,tokPtr,true,StCtrl);
          iVar7 = QList<QMakeParser::BlockScope>::end
                            (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
          iVar7.i[-1].nest = '\x02';
          goto LAB_00205e15;
        }
        pcVar12 = "Unexpected NOT operator in front of function definition.";
        sStack_90 = 0x39;
LAB_0020587e:
        psVar6 = (storage_type *)QByteArrayView::lengthHelperCharArray(pcVar12,sStack_90);
        QVar13.m_data = psVar6;
        QVar13.m_size = (qsizetype)&local_58;
        QString::fromLatin1(QVar13);
LAB_0020589d:
        this_00 = &local_58;
        bogusTest(this,tokPtr,(QString *)this_00);
      }
      else {
        a = (QString *)((anonymous_namespace)::statics + 0x30);
        bVar3 = comparesEqual(s1,(QString *)((anonymous_namespace)::statics + 0x30));
        uVar11 = 0x1a;
        if (bVar3) goto LAB_00205867;
        bVar3 = comparesEqual(s1,(QString *)((anonymous_namespace)::statics + 0x60));
        if (!bVar3) {
          bVar3 = comparesEqual(s1,(QString *)((anonymous_namespace)::statics + 0x90));
          if (!bVar3) {
            bVar3 = comparesEqual(s1,(QString *)((anonymous_namespace)::statics + 0xa8));
            uVar11 = 0x14;
            if (bVar3) {
LAB_00205bf0:
              if (*puVar5 == 0xf) {
                iVar7 = QList<QMakeParser::BlockScope>::end
                                  (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
                if ((iVar7.i[-1].nest & 1) != 0) goto LAB_00205cb4;
                pcVar12 = "Unexpected %1().";
                sStack_90 = 0x11;
              }
              else {
                pcVar12 = "%1() requires zero arguments.";
                sStack_90 = 0x1e;
              }
              psVar6 = (storage_type *)QByteArrayView::lengthHelperCharArray(pcVar12,sStack_90);
              QVar20.m_data = psVar6;
              QVar20.m_size = (qsizetype)&local_70;
              QString::fromLatin1(QVar20);
              goto LAB_00205d3c;
            }
            bVar3 = comparesEqual(s1,(QString *)((anonymous_namespace)::statics + 0xc0));
            uVar11 = 0x13;
            if (bVar3) goto LAB_00205bf0;
            bVar3 = comparesEqual(s1,(QString *)((anonymous_namespace)::statics + 0x78));
            if (!bVar3) goto LAB_00205de9;
            if ((((this->m_state == StNew) &&
                 (iVar7 = QList<QMakeParser::BlockScope>::end
                                    (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>),
                 iVar7.i[-1].braceLevel == 0)) &&
                ((ulong)(this->m_blockstack).super_QList<QMakeParser::BlockScope>.d.size < 2)) &&
               ((this->m_invert == 0 && (this->m_operator == NoOperator)))) {
              if ((*puVar5 == 0x208) && (uc[uVar10 + (ulong)uc[uVar10 + 6] + 7] == 0xf)) {
                QString::setRawData((QChar *)s1,(longlong)(uc + uVar10 + 7));
                bVar3 = comparesEqual(s1,(QString *)((anonymous_namespace)::statics + 0xd8));
                if (!bVar3) {
                  psVar6 = (storage_type *)
                           QByteArrayView::lengthHelperCharArray("Unknown option() %1.",0x15);
                  this_00 = &local_70;
                  QVar22.m_data = psVar6;
                  QVar22.m_size = (qsizetype)this_00;
                  QString::fromLatin1(QVar22);
                  QString::arg<QString,_true>
                            ((QString *)&local_58,(QString *)this_00,s1,0,(QChar)0x20);
                  parseError(this,(QString *)&local_58);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
                  goto LAB_00205d5d;
                }
                this->m_proFile->m_hostBuild = true;
                goto LAB_00205e15;
              }
              psVar6 = (storage_type *)
                       QByteArrayView::lengthHelperCharArray
                                 ("option() requires one literal argument.",0x28);
              QVar21.m_data = psVar6;
              QVar21.m_size = (qsizetype)&local_58;
              QString::fromLatin1(QVar21);
              goto LAB_00205aa1;
            }
            pcVar12 = "option() must appear outside any control structures.";
            sStack_90 = 0x35;
            goto LAB_0020587e;
          }
          iVar7 = QList<QMakeParser::BlockScope>::end
                            (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
          if ((iVar7.i[-1].nest & 2) == 0) {
            uVar11 = 0x12;
            if (*puVar5 == 0xf) {
LAB_00205cb4:
              if (this->m_invert == 0) {
                finalizeTest(this,tokPtr);
                iVar4 = (int)((ulong)((long)ptr - (long)puVar5) >> 1);
                memcpy(*tokPtr,puVar5,(ulong)(iVar4 * 2 - 2));
                puVar5 = *tokPtr;
                *tokPtr = puVar5 + (iVar4 - 1) + 1;
                puVar5[iVar4 - 1] = uVar11;
                goto LAB_00205e15;
              }
              psVar6 = (storage_type *)
                       QByteArrayView::lengthHelperCharArray
                                 ("Unexpected NOT operator in front of %1().",0x2a);
              QVar19.m_data = psVar6;
              QVar19.m_size = (qsizetype)&local_70;
              QString::fromLatin1(QVar19);
              QString::arg<QString,_true>
                        ((QString *)&local_58,(QString *)&local_70,s1,0,(QChar)0x20);
              goto LAB_00205d47;
            }
            pcVar12 = "Top-level return() requires zero arguments.";
            sStack_90 = 0x2c;
          }
          else {
            uVar11 = 0x12;
            if (argc < 2) goto LAB_00205cb4;
            pcVar12 = "return() requires zero or one argument.";
            sStack_90 = 0x28;
          }
          psVar6 = (storage_type *)QByteArrayView::lengthHelperCharArray(pcVar12,sStack_90);
          QVar18.m_data = psVar6;
          QVar18.m_size = (qsizetype)&local_58;
          QString::fromLatin1(QVar18);
          goto LAB_0020589d;
        }
        if (*puVar5 == 0xf) {
          iVar7 = QList<QMakeParser::BlockScope>::end
                            (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
          if ((iVar7.i[-1].nest & 2) == 0) {
            pcVar12 = "Unexpected %1().";
            sStack_90 = 0x11;
          }
          else {
            if (this->m_invert == 0) {
              flushScopes(this,tokPtr);
              iVar4 = this->m_markLine;
              if (iVar4 != 0) {
                puVar5 = *tokPtr;
                *puVar5 = 1;
                *tokPtr = puVar5 + 2;
                puVar5[1] = (ushort)iVar4;
                this->m_markLine = 0;
              }
              putOperator(this,tokPtr);
              puVar5 = *tokPtr;
              *tokPtr = puVar5 + 1;
              *puVar5 = 0x1c;
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                enterScope(this,tokPtr,true,StCtrl);
                return;
              }
              goto LAB_00205fa9;
            }
            pcVar12 = "Unexpected NOT operator in front of %1().";
            sStack_90 = 0x2a;
          }
          psVar6 = (storage_type *)QByteArrayView::lengthHelperCharArray(pcVar12,sStack_90);
          QVar17.m_data = psVar6;
          QVar17.m_size = (qsizetype)&local_70;
          QString::fromLatin1(QVar17);
          QString::arg<QString,_true>((QString *)&local_58,(QString *)&local_70,s1,0,(QChar)0x20);
        }
        else {
          psVar6 = (storage_type *)
                   QByteArrayView::lengthHelperCharArray("%1() requires zero arguments.",0x1e);
          QVar16.m_data = psVar6;
          QVar16.m_size = (qsizetype)&local_70;
          QString::fromLatin1(QVar16);
LAB_00205d3c:
          QString::arg<QString,_true>((QString *)&local_58,(QString *)&local_70,s1,0,(QChar)0x20);
        }
LAB_00205d47:
        bogusTest(this,tokPtr,(QString *)&local_58);
LAB_00205d55:
        this_00 = &local_70;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
    }
LAB_00205d5d:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  }
  else {
LAB_00205de9:
    finalizeTest(this,tokPtr);
    memcpy(*tokPtr,uc,(long)ptr - (long)uc & 0xffffffff);
    *tokPtr = (ushort *)((long)*tokPtr + ((long)ptr - (long)uc & 0x1fffffffeU));
  }
LAB_00205e15:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00205fa9:
  __stack_chk_fail();
}

Assistant:

void QMakeParser::finalizeCall(ushort *&tokPtr, ushort *uc, ushort *ptr, int argc)
{
    // Check for magic tokens
    if (*uc == TokHashLiteral) {
        uint nlen = uc[3];
        ushort *uce = uc + 4 + nlen;
        if (*uce == TokTestCall) {
            uce++;
            m_tmp.setRawData((QChar *)uc + 4, nlen);
            const QString *defName;
            ushort defType;
            if (m_tmp == statics.strfor) {
                if (!acceptColon("in front of for()")) {
                    bogusTest(tokPtr, QString());
                    return;
                }
                flushCond(tokPtr);
                putLineMarker(tokPtr);
                --ptr;
                Q_ASSERT(*ptr == TokFuncTerminator);
                if (*uce == (TokLiteral|TokNewStr)) {
                    nlen = uce[1];
                    uc = uce + 2 + nlen;
                    if (uc == ptr) {
                        // for(literal) (only "ever" would be legal if qmake was sane)
                        putTok(tokPtr, TokForLoop);
                        putHashStr(tokPtr, nullptr, (uint)0);
                        putBlockLen(tokPtr, 1 + 3 + nlen + 1);
                        putTok(tokPtr, TokHashLiteral);
                        putHashStr(tokPtr, uce + 2, nlen);
                      didFor:
                        putTok(tokPtr, TokValueTerminator);
                        enterScope(tokPtr, true, StCtrl);
                        m_blockstack.top().nest |= NestLoop;
                        return;
                    } else if (*uc == TokArgSeparator && argc == 2) {
                        // for(var, something)
                        uc++;
                        putTok(tokPtr, TokForLoop);
                        putHashStr(tokPtr, uce + 2, nlen);
                      doFor:
                        nlen = ptr - uc;
                        putBlockLen(tokPtr, nlen + 1);
                        putBlock(tokPtr, uc, nlen);
                        goto didFor;
                    }
                } else if (argc == 1) {
                    // for(non-literal) (this wouldn't be here if qmake was sane)
                    putTok(tokPtr, TokForLoop);
                    putHashStr(tokPtr, nullptr, (uint)0);
                    uc = uce;
                    goto doFor;
                }
                parseError(fL1S("Syntax is for(var, list), for(var, forever) or for(ever)."));
                return;
            } else if (m_tmp == statics.strdefineReplace) {
                defName = &statics.strdefineReplace;
                defType = TokReplaceDef;
                goto deffunc;
            } else if (m_tmp == statics.strdefineTest) {
                defName = &statics.strdefineTest;
                defType = TokTestDef;
              deffunc:
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of function definition."));
                    return;
                }
                flushScopes(tokPtr);
                putLineMarker(tokPtr);
                if (*uce == (TokLiteral|TokNewStr)) {
                    uint nlen = uce[1];
                    if (uce[nlen + 2] == TokFuncTerminator) {
                        putOperator(tokPtr);
                        putTok(tokPtr, defType);
                        putHashStr(tokPtr, uce + 2, nlen);
                        enterScope(tokPtr, true, StCtrl);
                        m_blockstack.top().nest = NestFunction;
                        return;
                    }
                }
                parseError(fL1S("%1(function) requires one literal argument.").arg(*defName));
                return;
            } else if (m_tmp == statics.strbypassNesting) {
                if (*uce != TokFuncTerminator) {
                    bogusTest(tokPtr, fL1S("%1() requires zero arguments.").arg(m_tmp));
                    return;
                }
                if (!(m_blockstack.top().nest & NestFunction)) {
                    bogusTest(tokPtr, fL1S("Unexpected %1().").arg(m_tmp));
                    return;
                }
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of %1().").arg(m_tmp));
                    return;
                }
                flushScopes(tokPtr);
                putLineMarker(tokPtr);
                putOperator(tokPtr);
                putTok(tokPtr, TokBypassNesting);
                enterScope(tokPtr, true, StCtrl);
                return;
            } else if (m_tmp == statics.strreturn) {
                if (m_blockstack.top().nest & NestFunction) {
                    if (argc > 1) {
                        bogusTest(tokPtr, fL1S("return() requires zero or one argument."));
                        return;
                    }
                } else {
                    if (*uce != TokFuncTerminator) {
                        bogusTest(tokPtr, fL1S("Top-level return() requires zero arguments."));
                        return;
                    }
                }
                defType = TokReturn;
                goto ctrlstm2;
            } else if (m_tmp == statics.strnext) {
                defType = TokNext;
                goto ctrlstm;
            } else if (m_tmp == statics.strbreak) {
                defType = TokBreak;
              ctrlstm:
                if (*uce != TokFuncTerminator) {
                    bogusTest(tokPtr, fL1S("%1() requires zero arguments.").arg(m_tmp));
                    return;
                }
                if (!(m_blockstack.top().nest & NestLoop)) {
                    bogusTest(tokPtr, fL1S("Unexpected %1().").arg(m_tmp));
                    return;
                }
              ctrlstm2:
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of %1().").arg(m_tmp));
                    return;
                }
                finalizeTest(tokPtr);
                putBlock(tokPtr, uce, ptr - uce - 1); // Only for TokReturn
                putTok(tokPtr, defType);
                return;
            } else if (m_tmp == statics.stroption) {
                if (m_state != StNew || m_blockstack.top().braceLevel || m_blockstack.size() > 1
                        || m_invert || m_operator != NoOperator) {
                    bogusTest(tokPtr, fL1S("option() must appear outside any control structures."));
                    return;
                }
                if (*uce == (TokLiteral|TokNewStr)) {
                    uint nlen = uce[1];
                    if (uce[nlen + 2] == TokFuncTerminator) {
                        m_tmp.setRawData((QChar *)uce + 2, nlen);
                        if (m_tmp == statics.strhost_build)
                            m_proFile->setHostBuild(true);
                        else
                            parseError(fL1S("Unknown option() %1.").arg(m_tmp));
                        return;
                    }
                }
                parseError(fL1S("option() requires one literal argument."));
                return;
            }
        }
    }

    finalizeTest(tokPtr);
    putBlock(tokPtr, uc, ptr - uc);
}